

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  TPZGeoMesh *mesh;
  bool bVar1;
  long lVar2;
  long lVar3;
  int x;
  long lVar4;
  TPZManVector<double,_20> blendFactor;
  TPZManVector<double,_3> notUsedHereVec;
  TPZFNMatrix<9,_double> phi;
  TPZFNMatrix<9,_double> notUsedHereMat;
  TPZFNMatrix<27,_double> projectedPointOverSide;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZVec<double> local_738;
  double adStack_718 [20];
  TPZManVector<double,_3> local_678;
  TPZFMatrix<double> local_640;
  double local_5b0 [10];
  TPZFMatrix<double> local_560;
  double local_4d0 [10];
  TPZFMatrix<double> local_480;
  double local_3f0 [28];
  TPZFMatrix<double> local_310;
  double local_280 [28];
  TPZFMatrix<double> local_1a0;
  double local_110 [28];
  
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  mesh = this->fGeoEl->fMesh;
  local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_678,3,(double *)&local_480);
  local_560.fElem = local_4d0;
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_560.fSize = 9;
  local_560.fGiven = local_560.fElem;
  TPZVec<int>::TPZVec(&local_560.fPivot.super_TPZVec<int>,0);
  local_560.fPivot.super_TPZVec<int>.fStore = local_560.fPivot.fExtAlloc;
  local_560.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_560.fPivot.super_TPZVec<int>.fNElements = 0;
  local_560.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_560.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_560.fWork.fStore = (double *)0x0;
  local_560.fWork.fNElements = 0;
  local_560.fWork.fNAlloc = 0;
  local_560.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_560,0.0);
  (*result->_vptr_TPZVec[3])(result,3);
  local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(result,(double *)&local_480,0,-1);
  if (this->fNeighbours[0].fGeoElIndex == -1) {
    local_640.fElem = local_5b0;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183dbe0;
    local_640.fSize = 9;
    local_640.fGiven = local_640.fElem;
    TPZVec<int>::TPZVec(&local_640.fPivot.super_TPZVec<int>,0);
    local_640.fPivot.super_TPZVec<int>.fStore = local_640.fPivot.fExtAlloc;
    local_640.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_640.fPivot.super_TPZVec<int>.fNElements = 0;
    local_640.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_640.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_640.fWork.fStore = (double *)0x0;
    local_640.fWork.fNElements = 0;
    local_640.fWork.fNAlloc = 0;
    local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
    pztopology::TPZLine::TShape<double>(xi,&local_640,&local_560);
    lVar3 = 0;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar4) ||
           ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (local_640.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        result->fStore[lVar4] =
             *(double *)
              ((long)coord->fElem +
              lVar4 * 8 + (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar3) *
             local_640.fElem[lVar2] + result->fStore[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 8;
      bVar1 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar1);
    TPZVec<double>::TPZVec(&local_738,0);
    local_738._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018c1ae8;
    local_738.fNElements = 1;
    local_738.fNAlloc = 0;
    adStack_718[0] = 0.0;
    local_480.fElem = local_3f0;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_480.fSize = 0x1b;
    local_738.fStore = adStack_718;
    local_480.fGiven = local_480.fElem;
    TPZVec<int>::TPZVec(&local_480.fPivot.super_TPZVec<int>,0);
    local_480.fPivot.super_TPZVec<int>.fStore = local_480.fPivot.fExtAlloc;
    local_480.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_480.fPivot.super_TPZVec<int>.fNElements = 0;
    local_480.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_480.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_480.fWork.fStore = (double *)0x0;
    local_480.fWork.fNElements = 0;
    local_480.fWork.fNAlloc = 0;
    local_480.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_480,0.0);
    local_310.fElem = local_280;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_310.fSize = 0x1b;
    local_310.fGiven = local_310.fElem;
    TPZVec<int>::TPZVec(&local_310.fPivot.super_TPZVec<int>,0);
    local_310.fPivot.super_TPZVec<int>.fStore = local_310.fPivot.fExtAlloc;
    local_310.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_310.fPivot.super_TPZVec<int>.fNElements = 0;
    local_310.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_310.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_310.fWork.fStore = (double *)0x0;
    local_310.fWork.fNElements = 0;
    local_310.fWork.fNAlloc = 0;
    local_310.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_310,0.0);
    local_1a0.fElem = local_110;
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018c1e38;
    local_1a0.fSize = 0x1b;
    local_1a0.fGiven = local_1a0.fElem;
    TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
    local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
    local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_1a0.fWork.fStore = (double *)0x0;
    local_1a0.fWork.fNElements = 0;
    local_1a0.fWork.fNAlloc = 0;
    local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018c1b48;
    TPZFMatrix<double>::operator=(&local_1a0,0.0);
    TPZFMatrix<double>::~TPZFMatrix(&local_1a0,&PTR_PTR_018c1e00);
    TPZFMatrix<double>::~TPZFMatrix(&local_310,&PTR_PTR_018c1e00);
    TPZFMatrix<double>::~TPZFMatrix(&local_480,&PTR_PTR_018c1e00);
    if (local_738.fStore == adStack_718) {
      local_738.fStore = (double *)0x0;
    }
    local_738.fNAlloc = 0;
    local_738._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    if (local_738.fStore != (double *)0x0) {
      operator_delete__(local_738.fStore);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_640,&PTR_PTR_0183dba8);
  }
  else {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&local_480,0);
    bVar1 = MapToNeighSide<double>(this,2,1,xi,(TPZVec<double> *)&local_480,&local_560);
    if (!bVar1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_310,this->fNeighbours,mesh);
    TPZGeoElSide::X((TPZGeoElSide *)&local_310,(TPZVec<double> *)&local_480,result);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_480);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_560,&PTR_PTR_0183dba8);
  TPZManVector<double,_3>::~TPZManVector(&local_678);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}